

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_parse_function_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateFieldBody
          (ParseFunctionGenerator *this,Formatter *format,WireType wiretype,FieldDescriptor *field)

{
  Options *pOVar1;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  bool bVar2;
  CppType CVar3;
  int field_number;
  Type TVar4;
  EnumDescriptor *this_00;
  OneofDescriptor *pOVar5;
  LogMessage *other;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar6;
  uint *options;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  FieldDescriptor *field_03;
  FieldDescriptor *field_04;
  char *local_828;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_788;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_708;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_6d0;
  LogFinisher local_691;
  LogMessage local_690;
  undefined1 local_658 [8];
  string zigzag;
  undefined1 local_630 [8];
  string size;
  string local_608;
  allocator local_5e1;
  string local_5e0;
  undefined1 local_5c0 [8];
  string type;
  uint32_t tag;
  AlphaNum local_578;
  AlphaNum local_548;
  string local_518;
  string local_4f8;
  AlphaNum local_4d8;
  AlphaNum local_4a8;
  string local_478;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_458;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_450;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_410;
  iterator local_3d0;
  size_type local_3c8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3c0;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38b;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_38a;
  undefined1 local_389;
  string local_388;
  AlphaNum local_368;
  AlphaNum local_338;
  string local_308;
  string local_2e8;
  AlphaNum local_2c8;
  AlphaNum local_298;
  string local_268;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_248;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_240;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_200;
  iterator local_1c0;
  size_type local_1b8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b0;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_17b;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_17a;
  undefined1 local_179;
  string local_178;
  string local_148;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_128;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  iterator local_a0;
  size_type local_98;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  undefined1 local_60 [8];
  SaveState formatter_state;
  FieldDescriptor *field_local;
  WireType wiretype_local;
  Formatter *format_local;
  ParseFunctionGenerator *this_local;
  
  formatter_state.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)field;
  Formatter::SaveState::SaveState((SaveState *)local_60,format);
  local_179 = 1;
  local_128 = &local_120;
  FieldName_abi_cxx11_
            (&local_148,
             (cpp *)formatter_state.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,field_00)
  ;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[5],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_120,(char (*) [5])0x77db8d,&local_148);
  pOVar1 = this->options_;
  ppVar6 = &local_e0;
  local_128 = &local_e0;
  CVar3 = FieldDescriptor::cpp_type
                    ((FieldDescriptor *)
                     formatter_state.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  PrimitiveTypeName_abi_cxx11_(&local_178,(cpp *)pOVar1,(Options *)(ulong)CVar3,(CppType)ppVar6);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[15],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_e0,(char (*) [15])"primitive_type",&local_178);
  local_179 = 0;
  local_a0 = &local_120;
  local_98 = 2;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator(&local_17b);
  __l_01._M_len = local_98;
  __l_01._M_array = local_a0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&local_90,__l_01,&local_17a,&local_17b);
  Formatter::AddMap(format,&local_90);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&local_90);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator(&local_17b);
  ppVar6 = &local_120;
  local_6d0 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_a0;
  do {
    local_6d0 = local_6d0 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(local_6d0);
  } while (local_6d0 != ppVar6);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_148);
  bVar2 = FieldDescriptor::is_repeated
                    ((FieldDescriptor *)
                     formatter_state.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (bVar2) {
    local_389 = 1;
    local_248 = &local_240;
    strings::AlphaNum::AlphaNum(&local_298,"add_");
    FieldName_abi_cxx11_
              (&local_2e8,
               (cpp *)formatter_state.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
               field_01);
    strings::AlphaNum::AlphaNum(&local_2c8,&local_2e8);
    StrCat_abi_cxx11_(&local_268,(protobuf *)&local_298,&local_2c8,(AlphaNum *)ppVar6);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_240,(char (*) [10])"put_field",&local_268);
    local_248 = &local_200;
    strings::AlphaNum::AlphaNum(&local_338,"add_");
    FieldName_abi_cxx11_
              (&local_388,
               (cpp *)formatter_state.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
               field_02);
    strings::AlphaNum::AlphaNum(&local_368,&local_388);
    StrCat_abi_cxx11_(&local_308,(protobuf *)&local_338,&local_368,(AlphaNum *)ppVar6);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_200,(char (*) [14])"mutable_field",&local_308);
    local_389 = 0;
    local_1c0 = &local_240;
    local_1b8 = 2;
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::allocator(&local_38b);
    __l_00._M_len = local_1b8;
    __l_00._M_array = local_1c0;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map(&local_1b0,__l_00,&local_38a,&local_38b);
    Formatter::AddMap(format,&local_1b0);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map(&local_1b0);
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~allocator(&local_38b);
    local_708 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_1c0;
    do {
      local_708 = local_708 + -1;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(local_708);
    } while (local_708 != &local_240);
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&local_388);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_2e8);
  }
  else {
    type.field_2._M_local_buf[0xf] = '\x01';
    local_458 = &local_450;
    strings::AlphaNum::AlphaNum(&local_4a8,"set_");
    FieldName_abi_cxx11_
              (&local_4f8,
               (cpp *)formatter_state.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
               field_03);
    strings::AlphaNum::AlphaNum(&local_4d8,&local_4f8);
    StrCat_abi_cxx11_(&local_478,(protobuf *)&local_4a8,&local_4d8,(AlphaNum *)ppVar6);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_450,(char (*) [10])"put_field",&local_478);
    local_458 = &local_410;
    strings::AlphaNum::AlphaNum(&local_548,"mutable_");
    FieldName_abi_cxx11_
              ((string *)&tag,
               (cpp *)formatter_state.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
               field_04);
    strings::AlphaNum::AlphaNum(&local_578,(string *)&tag);
    StrCat_abi_cxx11_(&local_518,(protobuf *)&local_548,&local_578,(AlphaNum *)ppVar6);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_char_(&)[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_410,(char (*) [14])"mutable_field",&local_518);
    type.field_2._M_local_buf[0xf] = '\0';
    local_3d0 = &local_450;
    local_3c8 = 2;
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(type.field_2._M_local_buf + 0xd));
    __l._M_len = local_3c8;
    __l._M_array = local_3d0;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map(&local_3c0,__l,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          (type.field_2._M_local_buf + 0xe),
          (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)(type.field_2._M_local_buf + 0xd));
    Formatter::AddMap(format,&local_3c0);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map(&local_3c0);
    std::
    allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(type.field_2._M_local_buf + 0xd));
    local_788 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_3d0;
    do {
      local_788 = local_788 + -1;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(local_788);
    } while (local_788 != &local_450);
    std::__cxx11::string::~string((string *)&local_518);
    std::__cxx11::string::~string((string *)&tag);
    std::__cxx11::string::~string((string *)&local_478);
    std::__cxx11::string::~string((string *)&local_4f8);
  }
  field_number = FieldDescriptor::number
                           ((FieldDescriptor *)
                            formatter_state.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  type.field_2._8_4_ = internal::WireFormatLite::MakeTag(field_number,wiretype);
  options = &switchD_0054580e::switchdataD_0078bae4;
  switch(wiretype) {
  case WIRETYPE_VARINT:
    pOVar1 = this->options_;
    CVar3 = FieldDescriptor::cpp_type
                      ((FieldDescriptor *)
                       formatter_state.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    PrimitiveTypeName_abi_cxx11_
              ((string *)local_5c0,(cpp *)pOVar1,(Options *)(ulong)CVar3,(CppType)options);
    TVar4 = FieldDescriptor::type
                      ((FieldDescriptor *)
                       formatter_state.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (TVar4 == TYPE_ENUM) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_5e0,"enum_type",&local_5e1);
      this_00 = FieldDescriptor::enum_type
                          ((FieldDescriptor *)
                           formatter_state.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      QualifiedClassName_abi_cxx11_
                (&local_608,(cpp *)this_00,(EnumDescriptor *)this->options_,(Options *)options);
      Formatter::Set<std::__cxx11::string>(format,&local_5e0,&local_608);
      std::__cxx11::string::~string((string *)&local_608);
      std::__cxx11::string::~string((string *)&local_5e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
      Formatter::operator()<>
                (format,"$uint64$ val = ::$proto_ns$::internal::ReadVarint64(&ptr);\nCHK_(ptr);\n");
      bVar2 = HasPreservingUnknownEnumSemantics
                        ((FieldDescriptor *)
                         formatter_state.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (!bVar2) {
        Formatter::operator()<>(format,"if (PROTOBUF_PREDICT_TRUE($enum_type$_IsValid(val))) {\n");
        Formatter::Indent(format);
      }
      Formatter::operator()<>(format,"$msg$_internal_$put_field$(static_cast<$enum_type$>(val));\n")
      ;
      bVar2 = HasPreservingUnknownEnumSemantics
                        ((FieldDescriptor *)
                         formatter_state.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (!bVar2) {
        Formatter::Outdent(format);
        size.field_2._12_4_ =
             FieldDescriptor::number
                       ((FieldDescriptor *)
                        formatter_state.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
        Formatter::operator()
                  (format,
                   "} else {\n  ::$proto_ns$::internal::WriteVarint($1$, val, $msg$mutable_unknown_fields());\n}\n"
                   ,(int *)(size.field_2._M_local_buf + 0xc));
      }
    }
    else {
      TVar4 = FieldDescriptor::type
                        ((FieldDescriptor *)
                         formatter_state.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (((TVar4 == TYPE_INT32) ||
          (TVar4 = FieldDescriptor::type
                             ((FieldDescriptor *)
                              formatter_state.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count
                             ), TVar4 == TYPE_SINT32)) ||
         (TVar4 = FieldDescriptor::type
                            ((FieldDescriptor *)
                             formatter_state.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count)
         , TVar4 == TYPE_UINT32)) {
        local_828 = "32";
      }
      else {
        local_828 = "64";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_630,local_828,(allocator *)(zigzag.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(zigzag.field_2._M_local_buf + 0xf));
      std::__cxx11::string::string((string *)local_658);
      TVar4 = FieldDescriptor::type
                        ((FieldDescriptor *)
                         formatter_state.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if ((TVar4 == TYPE_SINT32) ||
         (TVar4 = FieldDescriptor::type
                            ((FieldDescriptor *)
                             formatter_state.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count)
         , TVar4 == MAX_TYPE)) {
        std::__cxx11::string::operator=((string *)local_658,"ZigZag");
      }
      bVar2 = FieldDescriptor::is_repeated
                        ((FieldDescriptor *)
                         formatter_state.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if ((bVar2) ||
         (pOVar5 = FieldDescriptor::real_containing_oneof
                             ((FieldDescriptor *)
                              formatter_state.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count
                             ), pOVar5 != (OneofDescriptor *)0x0)) {
        Formatter::operator()
                  (format,
                   "$msg$_internal_$put_field$(::$proto_ns$::internal::ReadVarint$1$$2$(&ptr));\nCHK_(ptr);\n"
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_658,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_630);
      }
      else {
        bVar2 = HasHasbit((FieldDescriptor *)
                          formatter_state.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
        if (bVar2) {
          Formatter::operator()<>(format,"_Internal::set_has_$name$(&$has_bits$);\n");
        }
        Formatter::operator()
                  (format,
                   "$msg$$name$_ = ::$proto_ns$::internal::ReadVarint$1$$2$(&ptr);\nCHK_(ptr);\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_658,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_630);
      }
      std::__cxx11::string::~string((string *)local_658);
      std::__cxx11::string::~string((string *)local_630);
    }
    std::__cxx11::string::~string((string *)local_5c0);
    break;
  case WIRETYPE_FIXED64:
  case WIRETYPE_FIXED32:
    bVar2 = FieldDescriptor::is_repeated
                      ((FieldDescriptor *)
                       formatter_state.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if ((bVar2) ||
       (pOVar5 = FieldDescriptor::real_containing_oneof
                           ((FieldDescriptor *)
                            formatter_state.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count),
       pOVar5 != (OneofDescriptor *)0x0)) {
      Formatter::operator()<>
                (format,
                 "$msg$_internal_$put_field$(::$proto_ns$::internal::UnalignedLoad<$primitive_type$>(ptr));\nptr += sizeof($primitive_type$);\n"
                );
    }
    else {
      bVar2 = HasHasbit((FieldDescriptor *)
                        formatter_state.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (bVar2) {
        Formatter::operator()<>(format,"_Internal::set_has_$name$(&$has_bits$);\n");
      }
      Formatter::operator()<>
                (format,
                 "$msg$$name$_ = ::$proto_ns$::internal::UnalignedLoad<$primitive_type$>(ptr);\nptr += sizeof($primitive_type$);\n"
                );
    }
    break;
  case WIRETYPE_LENGTH_DELIMITED:
    GenerateLengthDelim(this,format,
                        (FieldDescriptor *)
                        formatter_state.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    Formatter::operator()<>(format,"CHK_(ptr);\n");
    break;
  case WIRETYPE_START_GROUP:
    Formatter::operator()
              (format,
               "ptr = ctx->ParseGroup($msg$_internal_$mutable_field$(), ptr, $1$);\nCHK_(ptr);\n",
               (uint *)(type.field_2._M_local_buf + 8));
    break;
  case WIRETYPE_END_GROUP:
    internal::LogMessage::LogMessage
              (&local_690,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_parse_function_generator.cc"
               ,0x3ab);
    other = internal::LogMessage::operator<<(&local_690,"Can\'t have end group field\n");
    internal::LogFinisher::operator=(&local_691,other);
    internal::LogMessage::~LogMessage(&local_690);
  }
  Formatter::SaveState::~SaveState((SaveState *)local_60);
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateFieldBody(
    Formatter& format, WireFormatLite::WireType wiretype,
    const FieldDescriptor* field) {
  Formatter::SaveState formatter_state(&format);
  format.AddMap(
      {{"name", FieldName(field)},
       {"primitive_type", PrimitiveTypeName(options_, field->cpp_type())}});
  if (field->is_repeated()) {
    format.AddMap({{"put_field", StrCat("add_", FieldName(field))},
                   {"mutable_field", StrCat("add_", FieldName(field))}});
  } else {
    format.AddMap(
        {{"put_field", StrCat("set_", FieldName(field))},
         {"mutable_field", StrCat("mutable_", FieldName(field))}});
  }
  uint32_t tag = WireFormatLite::MakeTag(field->number(), wiretype);
  switch (wiretype) {
    case WireFormatLite::WIRETYPE_VARINT: {
      std::string type = PrimitiveTypeName(options_, field->cpp_type());
      if (field->type() == FieldDescriptor::TYPE_ENUM) {
        format.Set("enum_type",
                   QualifiedClassName(field->enum_type(), options_));
        format(
            "$uint64$ val = ::$proto_ns$::internal::ReadVarint64(&ptr);\n"
            "CHK_(ptr);\n");
        if (!HasPreservingUnknownEnumSemantics(field)) {
          format("if (PROTOBUF_PREDICT_TRUE($enum_type$_IsValid(val))) {\n");
          format.Indent();
        }
        format("$msg$_internal_$put_field$(static_cast<$enum_type$>(val));\n");
        if (!HasPreservingUnknownEnumSemantics(field)) {
          format.Outdent();
          format(
              "} else {\n"
              "  ::$proto_ns$::internal::WriteVarint("
              "$1$, val, $msg$mutable_unknown_fields());\n"
              "}\n",
              field->number());
        }
      } else {
        std::string size = (field->type() == FieldDescriptor::TYPE_INT32 ||
                            field->type() == FieldDescriptor::TYPE_SINT32 ||
                            field->type() == FieldDescriptor::TYPE_UINT32)
                               ? "32"
                               : "64";
        std::string zigzag;
        if ((field->type() == FieldDescriptor::TYPE_SINT32 ||
             field->type() == FieldDescriptor::TYPE_SINT64)) {
          zigzag = "ZigZag";
        }
        if (field->is_repeated() || field->real_containing_oneof()) {
          format(
              "$msg$_internal_$put_field$("
              "::$proto_ns$::internal::ReadVarint$1$$2$(&ptr));\n"
              "CHK_(ptr);\n",
              zigzag, size);
        } else {
          if (HasHasbit(field)) {
            format("_Internal::set_has_$name$(&$has_bits$);\n");
          }
          format(
              "$msg$$name$_ = ::$proto_ns$::internal::ReadVarint$1$$2$(&ptr);\n"
              "CHK_(ptr);\n",
              zigzag, size);
        }
      }
      break;
    }
    case WireFormatLite::WIRETYPE_FIXED32:
    case WireFormatLite::WIRETYPE_FIXED64: {
      if (field->is_repeated() || field->real_containing_oneof()) {
        format(
            "$msg$_internal_$put_field$("
            "::$proto_ns$::internal::UnalignedLoad<$primitive_type$>(ptr));\n"
            "ptr += sizeof($primitive_type$);\n");
      } else {
        if (HasHasbit(field)) {
          format("_Internal::set_has_$name$(&$has_bits$);\n");
        }
        format(
            "$msg$$name$_ = "
            "::$proto_ns$::internal::UnalignedLoad<$primitive_type$>(ptr);\n"
            "ptr += sizeof($primitive_type$);\n");
      }
      break;
    }
    case WireFormatLite::WIRETYPE_LENGTH_DELIMITED: {
      GenerateLengthDelim(format, field);
      format("CHK_(ptr);\n");
      break;
    }
    case WireFormatLite::WIRETYPE_START_GROUP: {
      format(
          "ptr = ctx->ParseGroup($msg$_internal_$mutable_field$(), ptr, $1$);\n"
          "CHK_(ptr);\n",
          tag);
      break;
    }
    case WireFormatLite::WIRETYPE_END_GROUP: {
      GOOGLE_LOG(FATAL) << "Can't have end group field\n";
      break;
    }
  }  // switch (wire_type)
}